

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall
Alice::ObliviousTranslate
          (Alice *this,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_P,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_D)

{
  long addr;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *pvVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int j;
  long lVar5;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_a8;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_90;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_78;
  _Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_60;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *local_48;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *local_40;
  long local_38;
  
  local_48 = Perm_P;
  local_40 = Perm_D;
  if (ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
      ::fout == '\0') {
    iVar2 = __cxa_guard_acquire(&ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                                 ::fout);
    if (iVar2 != 0) {
      std::ofstream::ofstream
                (ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                 ::fout,"../debug/alice/DebugTranslate_A.txt",_S_out);
      __cxa_atexit(std::ofstream::~ofstream,
                   ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                   ::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                           ::fout);
    }
  }
  lVar5 = 0;
  lVar3 = 0;
  while (pvVar1 = local_40, lVar3 < (this->super_Party).n_p) {
    addr = **(long **)((long)&(((this->super_Party).P.
                                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                              super__Vector_impl_data + lVar5);
    local_38 = lVar3;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_60,
               local_40);
    lVar3 = ObliviousTranslateSingleAddress
                      (this,addr,
                       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       &local_60);
    **(long **)((long)&(((this->super_Party).P.
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data + lVar5) = lVar3;
    std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
              (&local_60);
    lVar3 = *(long *)(*(long *)((long)&(((this->super_Party).P.
                                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                       super__Vector_impl_data + lVar5) + 8);
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_a8,
               pvVar1);
    lVar3 = ObliviousTranslateSingleAddress
                      (this,lVar3,
                       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       &local_a8);
    *(long *)(*(long *)((long)&(((this->super_Party).P.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data + lVar5) + 8) = lVar3;
    std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
              (&local_a8);
    pvVar1 = local_48;
    lVar3 = *(long *)(*(long *)((long)&(((this->super_Party).P.
                                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                       super__Vector_impl_data + lVar5) + 0x10);
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_90,
               local_48);
    lVar3 = ObliviousTranslateSingleAddress
                      (this,lVar3,
                       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       &local_90);
    *(long *)(*(long *)((long)&(((this->super_Party).P.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data + lVar5) + 0x10) = lVar3;
    std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
              (&local_90);
    lVar3 = *(long *)(*(long *)((long)&(((this->super_Party).P.
                                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                       super__Vector_impl_data + lVar5) + 0x18);
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&local_78,
               pvVar1);
    lVar3 = ObliviousTranslateSingleAddress
                      (this,lVar3,
                       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       &local_78);
    *(long *)(*(long *)((long)&(((this->super_Party).P.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data + lVar5) + 0x18) = lVar3;
    std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
              (&local_78);
    lVar5 = lVar5 + 0x18;
    lVar3 = local_38 + 1;
  }
  poVar4 = std::operator<<((ostream *)
                           ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                           ::fout,"Translation # ");
  iVar2 = ObliviousTranslate::count;
  ObliviousTranslate::count = ObliviousTranslate::count + 1;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::operator<<(poVar4,"\n");
  for (local_38 = 0; local_38 < (this->super_Party).n_p; local_38 = local_38 + 1) {
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      poVar4 = std::ostream::_M_insert<long>(0x10c448);
      std::operator<<(poVar4," ");
    }
    std::operator<<((ostream *)
                    ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                    ::fout,"\n");
  }
  return;
}

Assistant:

void Alice::ObliviousTranslate(std::vector<std::pair<long,long>> Perm_P, std::vector<std::pair<long,long>>Perm_D)
{
    static int count=0;
    static std::ofstream fout("../debug/alice/DebugTranslate_A.txt");
    for(int i = 0; i < n_p; i++)
    {
        P[i][0] = ObliviousTranslateSingleAddress(P[i][0], Perm_D);
        P[i][1] = ObliviousTranslateSingleAddress(P[i][1], Perm_D);
        P[i][2] = ObliviousTranslateSingleAddress(P[i][2], Perm_P);
        P[i][3] = ObliviousTranslateSingleAddress(P[i][3], Perm_P);
    }
    fout<<"Translation # "<<count++<<"\n";
    for(int i=0; i<n_p; i++)
    {
        for(int j=0; j<5; j++)
            fout<<P[i][j]<<" ";
        fout<<"\n";
    }    

}